

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS ref_import_by_extension(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  char *__s1;
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  FILE *__stream;
  undefined8 uVar7;
  uint *puVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  char *__s1_00;
  REF_INT new_cell;
  REF_INT face_id;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT new_node;
  REF_DBL swapped_dbl;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT new_qua;
  REF_INT new_tri;
  REF_INT nodes [27];
  undefined4 local_164;
  uint local_160;
  uint local_15c;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  uint local_14c;
  REF_DBL local_148;
  uint local_13c;
  REF_GRID_conflict *local_138;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  int local_d8;
  int local_d4;
  long local_d0;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  uint local_a8 [30];
  
  sVar6 = strlen(filename);
  iVar3 = strcmp(filename + (sVar6 - 10),".lb8.ugrid");
  if (iVar3 == 0) {
    uVar5 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,0);
    if (uVar5 == 0) {
LAB_0015f61c:
      uVar5 = ref_grid_inward_boundary_orientation(*ref_grid_ptr);
      if (uVar5 == 0) {
        return 0;
      }
      pcVar12 = "inward boundary orientation";
      uVar7 = 0x6e2;
    }
    else {
      pcVar12 = "lb8_ugrid failed";
      uVar7 = 0x6ad;
    }
  }
  else {
    iVar3 = strcmp(filename + (sVar6 - 9),".b8.ugrid");
    if (iVar3 == 0) {
      uVar5 = ref_import_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,0);
      if (uVar5 == 0) goto LAB_0015f61c;
      pcVar12 = "b8_ugrid failed";
      uVar7 = 0x6b1;
    }
    else {
      local_138 = ref_grid_ptr;
      iVar3 = strcmp(filename + (sVar6 - 0xb),".lb8l.ugrid");
      ref_grid_ptr = local_138;
      if (iVar3 == 0) {
        uVar5 = ref_import_bin_ugrid(local_138,ref_mpi,filename,0,1);
        if (uVar5 == 0) goto LAB_0015f61c;
        pcVar12 = "lb8_ugrid failed";
        uVar7 = 0x6b5;
      }
      else {
        iVar3 = strcmp(filename + (sVar6 - 10),".b8l.ugrid");
        ref_grid_ptr = local_138;
        if (iVar3 == 0) {
          uVar5 = ref_import_bin_ugrid(local_138,ref_mpi,filename,1,1);
          if (uVar5 == 0) goto LAB_0015f61c;
          pcVar12 = "b8_ugrid failed";
          uVar7 = 0x6b9;
        }
        else {
          iVar3 = strcmp(filename + (sVar6 - 0xc),".lb8.ugrid64");
          ref_grid_ptr = local_138;
          if (iVar3 == 0) {
            uVar5 = ref_import_bin_ugrid(local_138,ref_mpi,filename,0,1);
            if (uVar5 == 0) goto LAB_0015f61c;
            pcVar12 = "lb8_ugrid failed";
            uVar7 = 0x6bd;
          }
          else {
            iVar3 = strcmp(filename + (sVar6 - 0xb),".b8.ugrid64");
            ref_grid_ptr = local_138;
            if (iVar3 == 0) {
              uVar5 = ref_import_bin_ugrid(local_138,ref_mpi,filename,1,1);
              if (uVar5 == 0) goto LAB_0015f61c;
              pcVar12 = "b8_ugrid failed";
              uVar7 = 0x6c1;
            }
            else {
              iVar3 = strcmp(filename + (sVar6 - 9),".r8.ugrid");
              ref_grid_ptr = local_138;
              if (iVar3 == 0) {
                uVar5 = ref_grid_create(local_138,ref_mpi);
                if (uVar5 == 0) {
                  pRVar1 = *ref_grid_ptr;
                  ref_node = pRVar1->node;
                  __stream = fopen(filename,"r");
                  if (__stream == (FILE *)0x0) {
                    printf("unable to open %s\n",filename);
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x28c,"ref_import_r8_ugrid","unable to open file");
                    uVar5 = 2;
                  }
                  else {
                    sVar6 = fread(&local_164,4,1,__stream);
                    if (sVar6 != 1) {
                      pcVar12 = "nnode";
                      uVar7 = 0x28e;
                      goto LAB_0015ee13;
                    }
                    uVar11 = (ulong)local_164._2_1_ << 8 |
                             (long)(local_164 << 0x18) | (ulong)local_164._1_1_ << 0x10 |
                             (ulong)local_164._3_1_;
                    local_164 = (int)uVar11;
                    if (local_164 != 0x1c) {
                      pcVar12 = "header start record size";
                      lVar10 = 0x1c;
                      uVar7 = 0x290;
                      goto LAB_0015eec6;
                    }
                    sVar6 = fread(&local_150,4,1,__stream);
                    if (sVar6 == 1) {
                      sVar6 = fread(&local_154,4,1,__stream);
                      if (sVar6 != 1) {
                        pcVar12 = "ntri";
                        uVar7 = 0x293;
                        goto LAB_0015ee13;
                      }
                      sVar6 = fread(&local_158,4,1,__stream);
                      if (sVar6 != 1) {
                        pcVar12 = "nqua";
                        uVar7 = 0x294;
                        goto LAB_0015ee13;
                      }
                      sVar6 = fread(&local_124,4,1,__stream);
                      if (sVar6 != 1) {
                        pcVar12 = "ntet";
                        uVar7 = 0x295;
                        goto LAB_0015ee13;
                      }
                      sVar6 = fread(&local_128,4,1,__stream);
                      if (sVar6 != 1) {
                        pcVar12 = "npyr";
                        uVar7 = 0x296;
                        goto LAB_0015ee13;
                      }
                      sVar6 = fread(&local_12c,4,1,__stream);
                      if (sVar6 != 1) {
                        pcVar12 = "npri";
                        uVar7 = 0x297;
                        goto LAB_0015ee13;
                      }
                      sVar6 = fread(&local_130,4,1,__stream);
                      if (sVar6 != 1) {
                        pcVar12 = "nhex";
                        uVar7 = 0x298;
                        goto LAB_0015ee13;
                      }
                      sVar6 = fread(&local_164,4,1,__stream);
                      if (sVar6 != 1) {
                        pcVar12 = "nnode";
                        uVar7 = 0x29a;
                        goto LAB_0015ee13;
                      }
                      uVar11 = (ulong)local_164._2_1_ << 8 |
                               (long)(local_164 << 0x18) | (ulong)local_164._1_1_ << 0x10 |
                               (ulong)local_164._3_1_;
                      local_164 = (int)uVar11;
                      if (local_164 == 0x1c) {
                        local_b0 = (ulong)local_150._3_1_;
                        iVar9 = local_150 * 0x1000000;
                        iVar3 = (local_150 >> 8 & 0xff) * 0x10000;
                        uVar5 = (local_150 >> 0x10 & 0xff) * 0x100;
                        local_f0 = (long)(int)(iVar3 + iVar9 | uVar5) | local_b0;
                        local_150 = (uint)local_f0;
                        local_dc = local_154 >> 0x18;
                        local_b8 = (ulong)(local_154 * 0x1000000);
                        local_c0 = (ulong)local_154._1_1_ << 0x10;
                        local_e0 = (local_154 >> 0x10 & 0xff) << 8;
                        local_154 = (int)local_c0 + local_154 * 0x1000000 | local_e0 | local_dc;
                        local_118 = (ulong)local_154;
                        local_e4 = local_158 >> 0x18;
                        local_c8 = (ulong)(local_158 * 0x1000000);
                        local_d0 = (ulong)local_158._1_1_ << 0x10;
                        local_e8 = (local_158 >> 0x10 & 0xff) << 8;
                        local_158 = (int)local_d0 + local_158 * 0x1000000 | local_e8 | local_e4;
                        local_120 = (ulong)local_158;
                        local_124 = local_124 >> 0x18 | (local_124 & 0xff0000) >> 8 |
                                    (local_124 & 0xff00) << 8 | local_124 << 0x18;
                        local_f8 = (ulong)local_124;
                        local_128 = local_128 >> 0x18 | (local_128 & 0xff0000) >> 8 |
                                    (local_128 & 0xff00) << 8 | local_128 << 0x18;
                        local_100 = (ulong)local_128;
                        local_12c = local_12c >> 0x18 | (local_12c & 0xff0000) >> 8 |
                                    (local_12c & 0xff00) << 8 | local_12c << 0x18;
                        local_108 = (ulong)local_12c;
                        local_13c = local_130 >> 0x18 | (local_130 & 0xff0000) >> 8 |
                                    (local_130 & 0xff00) << 8 | local_130 << 0x18;
                        local_130 = local_13c;
                        sVar6 = fread(&local_164,4,1,__stream);
                        if (sVar6 != 1) {
                          pcVar12 = "nnode";
                          uVar7 = 0x2a6;
                          goto LAB_0015ee13;
                        }
                        uVar11 = (ulong)local_164._2_1_ << 8 |
                                 (long)(local_164 << 0x18) | (ulong)local_164._1_1_ << 0x10 |
                                 (ulong)local_164._3_1_;
                        local_164 = (int)uVar11;
                        iVar4 = ((int)local_f8 + (int)local_118) * 0x10 +
                                ((int)local_100 + (int)local_120) * 0x14 +
                                ((int)local_108 + (int)local_f0) * 0x18 + local_13c * 0x20;
                        local_110 = uVar11;
                        if (iVar4 == local_164) {
                          if (0 < (int)local_f0) {
                            iVar4 = uVar5 + (int)local_b0;
                            uVar11 = 0;
                            do {
                              uVar5 = ref_node_add(ref_node,uVar11,(REF_INT *)&local_14c);
                              if (uVar5 != 0) {
                                pcVar12 = "new_node";
                                uVar7 = 0x2ad;
                                goto LAB_0015e7fb;
                              }
                              if (uVar11 != local_14c) {
                                pcVar12 = "node index";
                                uVar7 = 0x2ae;
                                goto LAB_0015ee13;
                              }
                              sVar6 = fread(&local_148,8,1,__stream);
                              if (sVar6 != 1) {
                                pcVar12 = "x";
                                uVar7 = 0x2af;
                                goto LAB_0015ee13;
                              }
                              local_148 = (REF_DBL)((ulong)local_148 >> 0x38 |
                                                    ((ulong)local_148 & 0xff000000000000) >> 0x28 |
                                                    ((ulong)local_148 & 0xff0000000000) >> 0x18 |
                                                    ((ulong)local_148 & 0xff00000000) >> 8 |
                                                    ((ulong)local_148 & 0xff000000) << 8 |
                                                    ((ulong)local_148 & 0xff0000) << 0x18 |
                                                    ((ulong)local_148 & 0xff00) << 0x28 |
                                                   (long)local_148 << 0x38);
                              ref_node->real[(long)(int)local_14c * 0xf] = local_148;
                              sVar6 = fread(&local_148,8,1,__stream);
                              if (sVar6 != 1) {
                                pcVar12 = "y";
                                uVar7 = 0x2b2;
                                goto LAB_0015ee13;
                              }
                              local_148 = (REF_DBL)((ulong)local_148 >> 0x38 |
                                                    ((ulong)local_148 & 0xff000000000000) >> 0x28 |
                                                    ((ulong)local_148 & 0xff0000000000) >> 0x18 |
                                                    ((ulong)local_148 & 0xff00000000) >> 8 |
                                                    ((ulong)local_148 & 0xff000000) << 8 |
                                                    ((ulong)local_148 & 0xff0000) << 0x18 |
                                                    ((ulong)local_148 & 0xff00) << 0x28 |
                                                   (long)local_148 << 0x38);
                              ref_node->real[(long)(int)local_14c * 0xf + 1] = local_148;
                              sVar6 = fread(&local_148,8,1,__stream);
                              if (sVar6 != 1) {
                                pcVar12 = "z";
                                uVar7 = 0x2b5;
                                goto LAB_0015ee13;
                              }
                              local_148 = (REF_DBL)((ulong)local_148 >> 0x38 |
                                                    ((ulong)local_148 & 0xff000000000000) >> 0x28 |
                                                    ((ulong)local_148 & 0xff0000000000) >> 0x18 |
                                                    ((ulong)local_148 & 0xff00000000) >> 8 |
                                                    ((ulong)local_148 & 0xff000000) << 8 |
                                                    ((ulong)local_148 & 0xff0000) << 0x18 |
                                                    ((ulong)local_148 & 0xff00) << 0x28 |
                                                   (long)local_148 << 0x38);
                              ref_node->real[(long)(int)local_14c * 0xf + 2] = local_148;
                              uVar11 = uVar11 + 1;
                            } while ((uint)(iVar4 + iVar9 + iVar3) != uVar11);
                          }
                          uVar5 = ref_node_initialize_n_global(ref_node,local_f0);
                          if (uVar5 != 0) {
                            pcVar12 = "init glob";
                            uVar7 = 0x2ba;
                            goto LAB_0015e7fb;
                          }
                          pRVar2 = pRVar1->cell[3];
                          local_a8[3] = 0xffffffff;
                          if (0 < (int)local_118) {
                            iVar3 = 0;
                            do {
                              lVar10 = (long)pRVar2->node_per;
                              if (0 < lVar10) {
                                puVar8 = local_a8;
                                do {
                                  sVar6 = fread(puVar8,4,1,__stream);
                                  if (sVar6 != 1) {
                                    pcVar12 = "tri";
                                    uVar7 = 0x2c1;
                                    goto LAB_0015ee13;
                                  }
                                  uVar5 = *puVar8;
                                  *puVar8 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                             (uVar5 & 0xff00) << 8 | uVar5 << 0x18) - 1;
                                  puVar8 = puVar8 + 1;
                                  lVar10 = lVar10 + -1;
                                } while (lVar10 != 0);
                              }
                              uVar5 = ref_cell_add(pRVar2,(REF_INT *)local_a8,&local_d4);
                              if (uVar5 != 0) {
                                pcVar12 = "new tri";
                                uVar7 = 0x2c5;
                                goto LAB_0015e7fb;
                              }
                              if (iVar3 != local_d4) {
                                pcVar12 = "tri index";
                                uVar7 = 0x2c6;
                                goto LAB_0015ee13;
                              }
                              iVar3 = iVar3 + 1;
                            } while (iVar3 != (int)local_118);
                          }
                          pRVar2 = pRVar1->cell[6];
                          local_a8[4] = 0xffffffff;
                          if (0 < (int)local_120) {
                            iVar3 = 0;
                            do {
                              lVar10 = (long)pRVar2->node_per;
                              if (0 < lVar10) {
                                puVar8 = local_a8;
                                do {
                                  sVar6 = fread(puVar8,4,1,__stream);
                                  if (sVar6 != 1) {
                                    pcVar12 = "qua";
                                    uVar7 = 0x2ce;
                                    goto LAB_0015ee13;
                                  }
                                  uVar5 = *puVar8;
                                  *puVar8 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                             (uVar5 & 0xff00) << 8 | uVar5 << 0x18) - 1;
                                  puVar8 = puVar8 + 1;
                                  lVar10 = lVar10 + -1;
                                } while (lVar10 != 0);
                              }
                              uVar5 = ref_cell_add(pRVar2,(REF_INT *)local_a8,&local_d8);
                              if (uVar5 != 0) {
                                pcVar12 = "new qua";
                                uVar7 = 0x2d2;
                                goto LAB_0015e7fb;
                              }
                              if (iVar3 != local_d8) {
                                pcVar12 = "qua index";
                                uVar7 = 0x2d3;
                                goto LAB_0015ee13;
                              }
                              iVar3 = iVar3 + 1;
                            } while (iVar3 != (int)local_120);
                          }
                          if (0 < (int)local_118) {
                            pRVar2 = pRVar1->cell[3];
                            iVar3 = (int)local_b8 + (int)local_c0 + local_e0 + local_dc;
                            iVar9 = 0;
                            do {
                              sVar6 = fread(&local_15c,4,1,__stream);
                              if (sVar6 != 1) {
                                pcVar12 = "tri";
                                uVar7 = 0x2d8;
                                goto LAB_0015ee13;
                              }
                              local_15c = local_15c >> 0x18 | (local_15c & 0xff0000) >> 8 |
                                          (local_15c & 0xff00) << 8 | local_15c << 0x18;
                              pRVar2->c2n[(long)pRVar2->size_per * (long)iVar9 + 3] = local_15c;
                              iVar9 = iVar9 + 1;
                            } while (iVar3 != iVar9);
                          }
                          if (0 < (int)local_120) {
                            pRVar2 = pRVar1->cell[6];
                            iVar3 = (int)local_c8 + (int)local_d0 + local_e8 + local_e4;
                            iVar9 = 0;
                            do {
                              sVar6 = fread(&local_15c,4,1,__stream);
                              if (sVar6 != 1) {
                                pcVar12 = "qua";
                                uVar7 = 0x2df;
                                goto LAB_0015ee13;
                              }
                              local_15c = local_15c >> 0x18 | (local_15c & 0xff0000) >> 8 |
                                          (local_15c & 0xff00) << 8 | local_15c << 0x18;
                              pRVar2->c2n[(long)pRVar2->size_per * (long)iVar9 + 4] = local_15c;
                              iVar9 = iVar9 + 1;
                            } while (iVar3 != iVar9);
                          }
                          if (0 < (int)(uint)local_f8) {
                            pRVar2 = pRVar1->cell[8];
                            uVar13 = 0;
                            do {
                              lVar10 = (long)pRVar2->node_per;
                              if (0 < lVar10) {
                                puVar8 = local_a8;
                                do {
                                  sVar6 = fread(puVar8,4,1,__stream);
                                  if (sVar6 != 1) {
                                    pcVar12 = "tet";
                                    uVar7 = 0x2e8;
                                    goto LAB_0015ee13;
                                  }
                                  uVar5 = *puVar8;
                                  *puVar8 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                             (uVar5 & 0xff00) << 8 | uVar5 << 0x18) - 1;
                                  puVar8 = puVar8 + 1;
                                  lVar10 = lVar10 + -1;
                                } while (lVar10 != 0);
                              }
                              uVar5 = ref_cell_add(pRVar2,(REF_INT *)local_a8,(REF_INT *)&local_160)
                              ;
                              if (uVar5 != 0) {
                                pcVar12 = "tet cell";
                                uVar7 = 0x2ec;
                                goto LAB_0015e7fb;
                              }
                              if (uVar13 != local_160) {
                                pcVar12 = "tet index";
                                uVar7 = 0x2ed;
                                goto LAB_0015ee13;
                              }
                              uVar13 = uVar13 + 1;
                            } while (uVar13 != (uint)local_f8);
                          }
                          if (0 < (int)(uint)local_100) {
                            pRVar2 = pRVar1->cell[9];
                            uVar13 = 0;
                            do {
                              lVar10 = (long)pRVar2->node_per;
                              if (0 < lVar10) {
                                puVar8 = local_a8;
                                do {
                                  sVar6 = fread(puVar8,4,1,__stream);
                                  if (sVar6 != 1) {
                                    pcVar12 = "pyr";
                                    uVar7 = 0x2f4;
                                    goto LAB_0015ee13;
                                  }
                                  uVar5 = *puVar8;
                                  *puVar8 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                             (uVar5 & 0xff00) << 8 | uVar5 << 0x18) - 1;
                                  puVar8 = puVar8 + 1;
                                  lVar10 = lVar10 + -1;
                                } while (lVar10 != 0);
                              }
                              uVar5 = ref_cell_add(pRVar2,(REF_INT *)local_a8,(REF_INT *)&local_160)
                              ;
                              if (uVar5 != 0) {
                                pcVar12 = "pyr cell";
                                uVar7 = 0x2f8;
                                goto LAB_0015e7fb;
                              }
                              if (uVar13 != local_160) {
                                pcVar12 = "pyr index";
                                uVar7 = 0x2f9;
                                goto LAB_0015ee13;
                              }
                              uVar13 = uVar13 + 1;
                            } while (uVar13 != (uint)local_100);
                          }
                          if (0 < (int)(uint)local_108) {
                            pRVar2 = pRVar1->cell[10];
                            uVar13 = 0;
                            do {
                              lVar10 = (long)pRVar2->node_per;
                              if (0 < lVar10) {
                                puVar8 = local_a8;
                                do {
                                  sVar6 = fread(puVar8,4,1,__stream);
                                  if (sVar6 != 1) {
                                    pcVar12 = "pri";
                                    uVar7 = 0x300;
                                    goto LAB_0015ee13;
                                  }
                                  uVar5 = *puVar8;
                                  *puVar8 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                             (uVar5 & 0xff00) << 8 | uVar5 << 0x18) - 1;
                                  puVar8 = puVar8 + 1;
                                  lVar10 = lVar10 + -1;
                                } while (lVar10 != 0);
                              }
                              uVar5 = ref_cell_add(pRVar2,(REF_INT *)local_a8,(REF_INT *)&local_160)
                              ;
                              if (uVar5 != 0) {
                                pcVar12 = "pri cell";
                                uVar7 = 0x304;
                                goto LAB_0015e7fb;
                              }
                              if (uVar13 != local_160) {
                                pcVar12 = "pri index";
                                uVar7 = 0x305;
                                goto LAB_0015ee13;
                              }
                              uVar13 = uVar13 + 1;
                            } while (uVar13 != (uint)local_108);
                          }
                          if (0 < (int)local_13c) {
                            pRVar2 = pRVar1->cell[0xb];
                            uVar13 = 0;
                            do {
                              lVar10 = (long)pRVar2->node_per;
                              puVar8 = local_a8;
                              if (0 < lVar10) {
                                do {
                                  sVar6 = fread(puVar8,4,1,__stream);
                                  if (sVar6 != 1) {
                                    pcVar12 = "hex";
                                    uVar7 = 0x30c;
                                    goto LAB_0015ee13;
                                  }
                                  uVar5 = *puVar8;
                                  *puVar8 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                             (uVar5 & 0xff00) << 8 | uVar5 << 0x18) - 1;
                                  lVar10 = lVar10 + -1;
                                  puVar8 = puVar8 + 1;
                                } while (lVar10 != 0);
                              }
                              uVar5 = ref_cell_add(pRVar2,(REF_INT *)local_a8,(REF_INT *)&local_160)
                              ;
                              if (uVar5 != 0) {
                                pcVar12 = "hex cell";
                                uVar7 = 0x310;
                                goto LAB_0015e7fb;
                              }
                              if (uVar13 != local_160) {
                                pcVar12 = "hex index";
                                uVar7 = 0x311;
                                goto LAB_0015ee13;
                              }
                              uVar13 = uVar13 + 1;
                            } while (uVar13 != local_13c);
                          }
                          sVar6 = fread(&local_164,4,1,__stream);
                          if (sVar6 != 1) {
                            pcVar12 = "nnode";
                            uVar7 = 0x314;
                            goto LAB_0015ee13;
                          }
                          uVar11 = (ulong)local_164._2_1_ << 8 |
                                   (long)(local_164 << 0x18) | (ulong)local_164._1_1_ << 0x10 |
                                   (ulong)local_164._3_1_;
                          if ((int)local_110 == (int)uVar11) {
                            fclose(__stream);
                            ref_grid_ptr = local_138;
                            goto LAB_0015f61c;
                          }
                          lVar10 = (long)(int)local_110;
                          pcVar12 = "block end record size";
                          uVar7 = 0x318;
                        }
                        else {
                          lVar10 = (long)iVar4;
                          pcVar12 = "block start record size";
                          uVar7 = 0x2aa;
                        }
                      }
                      else {
                        pcVar12 = "header end record size";
                        lVar10 = 0x1c;
                        uVar7 = 0x29c;
                      }
LAB_0015eec6:
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,uVar7,"ref_import_r8_ugrid",pcVar12,lVar10,uVar11);
                    }
                    else {
                      pcVar12 = "nnode";
                      uVar7 = 0x292;
LAB_0015ee13:
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,uVar7,"ref_import_r8_ugrid",pcVar12);
                    }
                    uVar5 = 1;
                  }
                }
                else {
                  pcVar12 = "create grid";
                  uVar7 = 0x286;
LAB_0015e7fb:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,uVar7,"ref_import_r8_ugrid",(ulong)uVar5,pcVar12);
                }
                pcVar12 = "r8_ugrid failed";
                uVar7 = 0x6c4;
              }
              else {
                pcVar12 = filename + (sVar6 - 6);
                iVar3 = strcmp(pcVar12,".ugrid");
                if (iVar3 == 0) {
                  uVar5 = ref_import_ugrid(ref_grid_ptr,ref_mpi,filename);
                  if (uVar5 == 0) goto LAB_0015f61c;
                  pcVar12 = "ugrid failed";
                  uVar7 = 0x6c6;
                }
                else {
                  __s1 = filename + (sVar6 - 4);
                  iVar3 = strcmp(__s1,".tri");
                  if (iVar3 == 0) {
                    uVar5 = ref_import_tri(ref_grid_ptr,ref_mpi,filename);
                    if (uVar5 == 0) goto LAB_0015f61c;
                    pcVar12 = "tri failed";
                    uVar7 = 0x6c8;
                  }
                  else {
                    __s1_00 = filename + (sVar6 - 5);
                    iVar3 = strcmp(__s1_00,".surf");
                    if (iVar3 == 0) {
                      uVar5 = ref_import_surf(ref_grid_ptr,ref_mpi,filename);
                      if (uVar5 == 0) goto LAB_0015f61c;
                      pcVar12 = "surf failed";
                      uVar7 = 0x6ca;
                    }
                    else {
                      iVar3 = strcmp(pcVar12,".fgrid");
                      if (iVar3 == 0) {
                        uVar5 = ref_import_fgrid(ref_grid_ptr,ref_mpi,filename);
                        if (uVar5 == 0) goto LAB_0015f61c;
                        pcVar12 = "fgrid failed";
                        uVar7 = 0x6cc;
                      }
                      else {
                        iVar3 = strcmp(__s1,".su2");
                        if (iVar3 == 0) {
                          uVar5 = ref_import_su2(ref_grid_ptr,ref_mpi,filename);
                          if (uVar5 == 0) goto LAB_0015f61c;
                          pcVar12 = "su2 failed";
                          uVar7 = 0x6ce;
                        }
                        else {
                          iVar3 = strcmp(__s1,".msh");
                          if (iVar3 == 0) {
                            uVar5 = ref_import_msh(ref_grid_ptr,ref_mpi,filename);
                            if (uVar5 == 0) goto LAB_0015f61c;
                            pcVar12 = "msh failed";
                            uVar7 = 0x6d0;
                          }
                          else {
                            iVar3 = strcmp(__s1_00,".node");
                            if (iVar3 == 0) {
                              uVar5 = ref_import_tetgen_node(ref_grid_ptr,ref_mpi,filename);
                              if (uVar5 == 0) goto LAB_0015f61c;
                              pcVar12 = "tetgen node failed";
                              uVar7 = 0x6d3;
                            }
                            else {
                              iVar3 = strcmp(pcVar12,".meshb");
                              if (iVar3 == 0) {
                                uVar5 = ref_import_meshb(ref_grid_ptr,ref_mpi,filename);
                                if (uVar5 == 0) goto LAB_0015f61c;
                                pcVar12 = "meshb failed";
                                uVar7 = 0x6d5;
                              }
                              else {
                                iVar3 = strcmp(__s1_00,".grid");
                                if (iVar3 == 0) {
                                  uVar5 = ref_import_i_like_cfd_grid(ref_grid_ptr,ref_mpi,filename);
                                  if (uVar5 == 0) goto LAB_0015f61c;
                                  pcVar12 = "I Like CFD grid failed";
                                  uVar7 = 0x6d8;
                                }
                                else {
                                  iVar3 = strcmp(__s1,".avm");
                                  if (iVar3 != 0) {
                                    printf("%s: %d: %s %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x6dc,"input file name extension unknown",filename);
                                    pcVar12 = "unknown file extension";
                                    uVar5 = 1;
                                    uVar7 = 0x6de;
                                    uVar11 = 1;
                                    goto LAB_0015f64e;
                                  }
                                  uVar5 = ref_part_by_extension(ref_grid_ptr,ref_mpi,filename);
                                  if (uVar5 == 0) goto LAB_0015f61c;
                                  pcVar12 = "part failed";
                                  uVar7 = 0x6da;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  uVar11 = (ulong)uVar5;
LAB_0015f64e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar7,
         "ref_import_by_extension",uVar11,pcVar12);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_import_by_extension(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_FALSE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_FALSE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_TRUE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_TRUE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                             REF_TRUE),
        "lb8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_import_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                             REF_TRUE),
        "b8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 9], ".r8.ugrid") == 0) {
    RSS(ref_import_r8_ugrid(ref_grid_ptr, ref_mpi, filename),
        "r8_ugrid failed");
  } else if (strcmp(&filename[end_of_string - 6], ".ugrid") == 0) {
    RSS(ref_import_ugrid(ref_grid_ptr, ref_mpi, filename), "ugrid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tri") == 0) {
    RSS(ref_import_tri(ref_grid_ptr, ref_mpi, filename), "tri failed");
  } else if (strcmp(&filename[end_of_string - 5], ".surf") == 0) {
    RSS(ref_import_surf(ref_grid_ptr, ref_mpi, filename), "surf failed");
  } else if (strcmp(&filename[end_of_string - 6], ".fgrid") == 0) {
    RSS(ref_import_fgrid(ref_grid_ptr, ref_mpi, filename), "fgrid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".su2") == 0) {
    RSS(ref_import_su2(ref_grid_ptr, ref_mpi, filename), "su2 failed");
  } else if (strcmp(&filename[end_of_string - 4], ".msh") == 0) {
    RSS(ref_import_msh(ref_grid_ptr, ref_mpi, filename), "msh failed");
  } else if (strcmp(&filename[end_of_string - 5], ".node") == 0) {
    RSS(ref_import_tetgen_node(ref_grid_ptr, ref_mpi, filename),
        "tetgen node failed");
  } else if (strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_import_meshb(ref_grid_ptr, ref_mpi, filename), "meshb failed");
  } else if (strcmp(&filename[end_of_string - 5], ".grid") == 0) {
    RSS(ref_import_i_like_cfd_grid(ref_grid_ptr, ref_mpi, filename),
        "I Like CFD grid failed");
  } else if (strcmp(&filename[end_of_string - 4], ".avm") == 0) {
    RSS(ref_part_by_extension(ref_grid_ptr, ref_mpi, filename), "part failed");
  } else {
    printf("%s: %d: %s %s\n", __FILE__, __LINE__,
           "input file name extension unknown", filename);
    RSS(REF_FAILURE, "unknown file extension");
  }

  RSS(ref_grid_inward_boundary_orientation(*ref_grid_ptr),
      "inward boundary orientation");

  return REF_SUCCESS;
}